

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglengineshadermanager.cpp
# Opt level: O0

void __thiscall QOpenGLEngineShaderManager::useSimpleProgram(QOpenGLEngineShaderManager *this)

{
  QOpenGLShaderProgram *this_00;
  socklen_t in_ECX;
  sockaddr *__addr;
  int in_ESI;
  QOpenGL2PaintEngineExPrivate *in_RDI;
  QOpenGL2PaintEngineEx *active_engine;
  QOpenGLContextPrivate *ctx_d;
  undefined1 in_stack_ffffffffffffffdb;
  int in_stack_ffffffffffffffdc;
  
  this_00 = QOpenGLEngineSharedShaders::simpleProgram
                      (*(QOpenGLEngineSharedShaders **)&in_RDI->field_0x10);
  QOpenGLShaderProgram::bind(this_00,in_ESI,__addr,in_ECX);
  QOpenGLContext::d_func((QOpenGLContext *)0x140456);
  QOpenGL2PaintEngineEx::d_func((QOpenGL2PaintEngineEx *)0x140476);
  QOpenGL2PaintEngineExPrivate::setVertexAttribArrayEnabled
            (in_RDI,in_stack_ffffffffffffffdc,(bool)in_stack_ffffffffffffffdb);
  QOpenGL2PaintEngineEx::d_func((QOpenGL2PaintEngineEx *)0x14048f);
  QOpenGL2PaintEngineExPrivate::setVertexAttribArrayEnabled
            (in_RDI,in_stack_ffffffffffffffdc,(bool)in_stack_ffffffffffffffdb);
  QOpenGL2PaintEngineEx::d_func((QOpenGL2PaintEngineEx *)0x1404a8);
  QOpenGL2PaintEngineExPrivate::setVertexAttribArrayEnabled
            (in_RDI,in_stack_ffffffffffffffdc,(bool)in_stack_ffffffffffffffdb);
  in_RDI->field_0x20 = 1;
  return;
}

Assistant:

void QOpenGLEngineShaderManager::useSimpleProgram()
{
    sharedShaders->simpleProgram()->bind();
    QOpenGLContextPrivate* ctx_d = ctx->d_func();
    Q_UNUSED(ctx_d);

    QOpenGL2PaintEngineEx *active_engine = static_cast<QOpenGL2PaintEngineEx *>(ctx_d->active_engine);

    active_engine->d_func()->setVertexAttribArrayEnabled(QT_VERTEX_COORDS_ATTR, true);
    active_engine->d_func()->setVertexAttribArrayEnabled(QT_TEXTURE_COORDS_ATTR, false);
    active_engine->d_func()->setVertexAttribArrayEnabled(QT_OPACITY_ATTR, false);

    shaderProgNeedsChanging = true;
}